

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

int __thiscall QCss::Declaration::styleFeaturesValue(Declaration *this)

{
  int iVar1;
  quint64 qVar2;
  uint uVar3;
  DeclarationData *pDVar4;
  int i;
  ulong i_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  Value local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d.ptr;
  if (*(ulong *)&(pDVar4->parsed).d.field_0x18 < 4) {
    uVar3 = 0;
    for (i_00 = 0; i_00 < (ulong)(pDVar4->values).d.size; i_00 = i_00 + 1) {
      QList<QCss::Value>::value(&local_60,&pDVar4->values,i_00);
      ::QVariant::toString();
      qVar2 = findKnownValue((QString *)&QStack_78,styleFeatures,4);
      uVar3 = uVar3 | (uint)qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
      ::QVariant::~QVariant(&local_60.variant);
      pDVar4 = (this->d).d.ptr;
    }
    ::QVariant::QVariant((QVariant *)&local_60,uVar3);
    ::QVariant::operator=(&((this->d).d.ptr)->parsed,(QVariant *)&local_60);
    ::QVariant::~QVariant((QVariant *)&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return uVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar1 = ::QVariant::toInt((bool *)&pDVar4->parsed);
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int Declaration::styleFeaturesValue() const
{
    Q_ASSERT(d->propertyId == QtStyleFeatures);
    if (d->parsed.isValid())
        return d->parsed.toInt();
    int features = StyleFeature_None;
    for (int i = 0; i < d->values.size(); i++) {
        features |= static_cast<int>(findKnownValue(d->values.value(i).variant.toString(),
                                     styleFeatures, NumKnownStyleFeatures));
    }
    d->parsed = features;
    return features;
}